

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::continue_statement::~continue_statement(continue_statement *this)

{
  continue_statement *this_local;
  
  ~continue_statement(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

statement_type type() const override { return statement_type::continue_; }